

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf.c
# Opt level: O0

void latency_client(char *addr,size_t msgsize,int trips)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  float local_4c;
  float latency;
  float total;
  int i;
  int rv;
  nng_time end;
  nng_time start;
  nng_msg *msg;
  nng_socket s;
  int trips_local;
  size_t msgsize_local;
  char *addr_local;
  
  msg._4_4_ = trips;
  _s = msgsize;
  iVar1 = (*open_client)((nng_socket *)&msg);
  if (iVar1 != 0) {
    uVar3 = nng_strerror(iVar1);
    die("nng_socket: %s",uVar3);
  }
  iVar1 = nng_dial(msg._0_4_,addr,0,0);
  if (iVar1 != 0) {
    uVar3 = nng_strerror(iVar1);
    die("nng_dial: %s",uVar3);
  }
  nng_msleep(100);
  iVar2 = nng_msg_alloc(&start,_s);
  if (iVar2 != 0) {
    uVar3 = nng_strerror(iVar1);
    die("nng_msg_alloc: %s",uVar3);
  }
  lVar4 = nng_clock();
  for (latency = 0.0; (int)latency < (int)msg._4_4_; latency = (float)((int)latency + 1)) {
    iVar1 = nng_sendmsg(msg._0_4_,start,0);
    if (iVar1 != 0) {
      uVar3 = nng_strerror(iVar1);
      die("nng_sendmsg: %s",uVar3);
    }
    iVar1 = nng_recvmsg(msg._0_4_,&start,0);
    if (iVar1 != 0) {
      uVar3 = nng_strerror(iVar1);
      die("nng_recvmsg: %s",uVar3);
    }
  }
  lVar5 = nng_clock();
  nng_msg_free(start);
  nng_socket_close(msg._0_4_);
  local_4c = (float)(ulong)(lVar5 - lVar4);
  iVar1 = msg._4_4_ << 1;
  printf("total time: %.3f [s]\n",(double)(local_4c / 1000.0));
  printf("message size: %d [B]\n",_s & 0xffffffff);
  printf("round trip count: %d\n",(ulong)msg._4_4_);
  printf("average latency: %.3f [us]\n",(double)(((local_4c / 1000.0) * 1e+06) / (float)iVar1));
  return;
}

Assistant:

void
latency_client(const char *addr, size_t msgsize, int trips)
{
	nng_socket s;
	nng_msg   *msg;
	nng_time   start, end;
	int        rv;
	int        i;
	float      total;
	float      latency;
	if ((rv = open_client(&s)) != 0) {
		die("nng_socket: %s", nng_strerror(rv));
	}

	// XXX: set no delay
	// XXX: other options (TLS in the future?, Linger?)

	if ((rv = nng_dial(s, addr, NULL, 0)) != 0) {
		die("nng_dial: %s", nng_strerror(rv));
	}

	nng_msleep(100);

	if (nng_msg_alloc(&msg, msgsize) != 0) {
		die("nng_msg_alloc: %s", nng_strerror(rv));
	}

	start = nng_clock();
	for (i = 0; i < trips; i++) {
		if ((rv = nng_sendmsg(s, msg, 0)) != 0) {
			die("nng_sendmsg: %s", nng_strerror(rv));
		}

		if ((rv = nng_recvmsg(s, &msg, 0)) != 0) {
			die("nng_recvmsg: %s", nng_strerror(rv));
		}
	}
	end = nng_clock();

	nng_msg_free(msg);
	nng_socket_close(s);

	total   = (float) ((end - start)) / 1000;
	latency = ((float) ((total * 1000000)) / (float) (trips * 2));
	printf("total time: %.3f [s]\n", total);
	printf("message size: %d [B]\n", (int) msgsize);
	printf("round trip count: %d\n", trips);
	printf("average latency: %.3f [us]\n", latency);
}